

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandleLCovCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  pointer *this_00;
  cmCTest *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  int __errnum;
  char *pcVar5;
  ostream *poVar6;
  reference pbVar7;
  void *pvVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  ulong uVar9;
  mapped_type *this_01;
  reference pvVar10;
  long lVar11;
  size_type sVar12;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  string local_34e0 [32];
  undefined1 local_34c0 [8];
  ostringstream cmCTestLog_msg_26;
  string local_3348 [32];
  undefined1 local_3328 [8];
  ostringstream cmCTestLog_msg_25;
  value_type_conflict2 local_31b0;
  int local_31ac;
  string local_31a8 [4];
  int lineIdx;
  string lineNumber;
  string local_3180 [4];
  int cov;
  string prefix;
  undefined1 local_3140 [8];
  ostringstream cmCTestLog_msg_24;
  undefined1 local_2fc8 [8];
  string nl;
  long cnt;
  undefined1 local_2f80 [8];
  ostringstream cmCTestLog_msg_23;
  long local_2e08;
  ifstream ifile;
  string local_2c00 [32];
  undefined1 local_2be0 [8];
  ostringstream cmCTestLog_msg_22;
  SingleFileCoverageVector *vec;
  undefined1 local_2a40 [8];
  ostringstream cmCTestLog_msg_21;
  string local_28c8 [32];
  undefined1 local_28a8 [8];
  ostringstream cmCTestLog_msg_20;
  string local_2730 [32];
  undefined1 local_2710 [8];
  ostringstream cmCTestLog_msg_19;
  string *t;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string local_2558 [32];
  undefined1 local_2538 [8];
  ostringstream cmCTestLog_msg_18;
  undefined1 local_23b8 [4];
  int success;
  string srcname;
  undefined1 local_2378 [8];
  ostringstream cmCTestLog_msg_17;
  long local_2200;
  ifstream srcead;
  string *file;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_1fb8 [8];
  ostringstream cmCTestLog_msg_16;
  undefined1 local_1e40 [8];
  string daGlob;
  undefined1 local_1e00 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lcovFiles;
  string dir;
  Glob gl;
  string lcovFile;
  string sourceFile;
  string *line;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  undefined1 local_1cd8 [8];
  ostringstream cmCTestLog_msg_15;
  string local_1b60 [32];
  undefined1 local_1b40 [8];
  ostringstream cmCTestLog_msg_14;
  string local_19c8 [32];
  undefined1 local_19a8 [8];
  ostringstream cmCTestLog_msg_13;
  string local_1830 [32];
  undefined1 local_1810 [8];
  ostringstream cmCTestLog_msg_12;
  string local_1698 [32];
  undefined1 local_1678 [8];
  ostringstream cmCTestLog_msg_11;
  int local_14f4;
  int res;
  int retVal;
  string errors;
  string output;
  undefined1 local_1490 [8];
  ostringstream cmCTestLog_msg_10;
  string local_1318 [32];
  undefined1 local_12f8 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1180 [32];
  undefined1 local_1160 [8];
  ostringstream cmCTestLog_msg_8;
  undefined1 local_fe8 [8];
  cmWorkingDirectory workdir;
  string fileDir;
  undefined1 local_f80 [8];
  ostringstream cmCTestLog_msg_7;
  string *f;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string command;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_dc0;
  const_iterator local_db8;
  undefined1 local_db0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  covargs;
  cmCTestCoverageHandlerLocale locale_C;
  string local_d70 [4];
  int file_count;
  undefined1 local_d50 [8];
  ostringstream cmCTestLog_msg_6;
  string local_bd8 [32];
  undefined1 local_bb8 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_a40 [8];
  string actualSourceFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingFiles;
  string testingDir;
  undefined1 local_9b0 [8];
  ostringstream cmCTestLog_msg_4;
  string local_838 [32];
  undefined1 local_818 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_6a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_668 [8];
  ostringstream cmCTestLog_msg_2;
  string local_4f0 [32];
  undefined1 local_4d0 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_358 [8];
  RegularExpression st2re3;
  string local_280 [8];
  string st2lcovOutputRex3;
  string local_258 [32];
  undefined1 local_238 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string lcovExtraFlags;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string lcovCommand;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  lcovCommand.field_2._8_8_ = cont;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CoverageCommand",&local_61);
  cmCTest::GetCTestConfiguration((string *)local_40,pcVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CoverageExtraFlags",&local_b9);
  cmCTest::GetCTestConfiguration((string *)local_98,pcVar1,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"codecov");
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    poVar6 = std::operator<<((ostream *)local_238," Not a valid Intel Coverage command.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x532,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    this_local._4_4_ = 0;
    st2lcovOutputRex3.field_2._12_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_280,"[0-9]+%",(allocator<char> *)&st2re3.field_0xcf);
    std::allocator<char>::~allocator((allocator<char> *)&st2re3.field_0xcf);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmsys::RegularExpression::RegularExpression((RegularExpression *)local_358,pcVar5);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
    poVar6 = std::operator<<((ostream *)local_4d0," This is coverage command: ");
    poVar6 = std::operator<<(poVar6,(string *)local_40);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x53b,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_4f0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
    poVar6 = std::operator<<((ostream *)local_668," These are coverage command flags: ");
    poVar6 = std::operator<<(poVar6,(string *)local_98);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x540,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string
              ((string *)
               &files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_6a0);
    bVar3 = FindLCovFiles(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_6a0);
    if (bVar3) {
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_6a0);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9b0);
        poVar6 = std::operator<<((ostream *)local_9b0," Cannot find any LCov coverage files.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x54c,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(testingDir.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9b0);
        this_local._4_4_ = 0;
        st2lcovOutputRex3.field_2._12_4_ = 1;
      }
      else {
        cmCTest::GetBinaryDir_abi_cxx11_
                  ((string *)&missingFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (this->super_cmCTestGenericHandler).CTest);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&actualSourceFile.field_2 + 8));
        std::__cxx11::string::string((string *)local_a40);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bb8);
        poVar6 = std::operator<<((ostream *)local_bb8,
                                 "   Processing coverage (each . represents one file):");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x558,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_bd8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bb8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d50);
        std::operator<<((ostream *)local_d50,"    ");
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x559,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_d70);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d50);
        locale_C.lc_all.field_2._12_4_ = 0;
        cmCTestCoverageHandlerLocale::cmCTestCoverageHandlerLocale
                  ((cmCTestCoverageHandlerLocale *)
                   &covargs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmSystemTools::ParseArguments
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_db0,(string *)local_98);
        local_dc0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_db0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_db8,&local_dc0);
        command.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_db0,local_db8,(value_type *)local_40);
        joinCommandLine((string *)&__range1,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_db0);
        __end1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_6a0);
        f = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_6a0);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&f), bVar3) {
          pbVar7 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f80);
          poVar6 = std::operator<<((ostream *)local_f80,".");
          std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x569,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)(fileDir.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f80);
          cmsys::SystemTools::GetFilenamePath((string *)&workdir.ResultCode,pbVar7);
          cmWorkingDirectory::cmWorkingDirectory
                    ((cmWorkingDirectory *)local_fe8,(string *)&workdir.ResultCode);
          bVar3 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_fe8);
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1160);
            poVar6 = std::operator<<((ostream *)local_1160,"Unable to change working directory to ")
            ;
            poVar6 = std::operator<<(poVar6,(string *)&workdir.ResultCode);
            poVar6 = std::operator<<(poVar6," : ");
            __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_fe8);
            pcVar5 = strerror(__errnum);
            poVar6 = std::operator<<(poVar6,pcVar5);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x570,pcVar5,false);
            std::__cxx11::string::~string(local_1180);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1160);
            *(int *)lcovCommand.field_2._8_8_ = *(int *)lcovCommand.field_2._8_8_ + 1;
            st2lcovOutputRex3.field_2._12_4_ = 0x11;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12f8);
            poVar6 = std::operator<<((ostream *)local_12f8,"Current coverage dir: ");
            poVar6 = std::operator<<(poVar6,(string *)&workdir.ResultCode);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x577,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string(local_1318);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12f8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1490);
            poVar6 = std::operator<<((ostream *)local_1490,(string *)&__range1);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                         ,0x579,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1490);
            std::__cxx11::string::string((string *)(errors.field_2._M_local_buf + 8));
            std::__cxx11::string::string((string *)&res);
            local_14f4 = 0;
            poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),
                                     "* Run coverage for: ");
            poVar6 = std::operator<<(poVar6,(string *)&workdir.ResultCode);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),"  Command: ");
            poVar6 = std::operator<<(poVar6,(string *)&__range1);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            pcVar5 = (char *)std::__cxx11::string::c_str();
            timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
            bVar3 = cmCTest::RunCommand(pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_db0,(string *)((long)&errors.field_2 + 8),
                                        (string *)&res,&local_14f4,pcVar5,(cmDuration)timeout.__r,
                                        Auto);
            poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),"  Output: ");
            poVar6 = std::operator<<(poVar6,(string *)(errors.field_2._M_local_buf + 8));
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<(*(ostream **)(lcovCommand.field_2._8_8_ + 0x78),"  Errors: ");
            poVar6 = std::operator<<(poVar6,(string *)&res);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            if (bVar3) {
              if (local_14f4 != 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_19a8);
                poVar6 = std::operator<<((ostream *)local_19a8,"Coverage command returned: ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_14f4);
                poVar6 = std::operator<<(poVar6," while processing: ");
                poVar6 = std::operator<<(poVar6,(string *)pbVar7);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x591,pcVar5,false);
                std::__cxx11::string::~string(local_19c8);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_19a8);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b40);
                poVar6 = std::operator<<((ostream *)local_1b40,"Command produced error: ");
                pvVar8 = (void *)std::ostream::operator<<(poVar6,*(int *)lcovCommand.field_2._8_8_);
                std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x593,pcVar5,false);
                std::__cxx11::string::~string(local_1b60);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b40);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1cd8);
              poVar6 = std::operator<<((ostream *)local_1cd8,
                                       "--------------------------------------------------------------"
                                      );
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              poVar6 = std::operator<<(poVar6,(string *)(errors.field_2._M_local_buf + 8));
              poVar6 = (ostream *)
                       std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              poVar6 = std::operator<<(poVar6,
                                       "--------------------------------------------------------------"
                                      );
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x59c,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string
                        ((string *)
                         &lines.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1cd8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
              cmsys::SystemTools::Split
                        ((string *)((long)&errors.field_2 + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2);
              __end2 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&__range2);
              line = (string *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2);
              while (bVar3 = __gnu_cxx::operator!=
                                       (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&line), bVar3) {
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
                std::__cxx11::string::string((string *)(lcovFile.field_2._M_local_buf + 8));
                std::__cxx11::string::string((string *)&gl.ListDirs);
                std::__cxx11::string::empty();
                cmsys::Glob::Glob((Glob *)((long)&dir.field_2 + 8));
                cmsys::Glob::RecurseOn((Glob *)((long)&dir.field_2 + 8));
                cmsys::Glob::RecurseThroughSymlinksOff((Glob *)((long)&dir.field_2 + 8));
                std::__cxx11::string::string
                          ((string *)
                           &lcovFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1e00);
                cmCTest::GetBinaryDir_abi_cxx11_
                          ((string *)((long)&daGlob.field_2 + 8),
                           (this->super_cmCTestGenericHandler).CTest);
                this_00 = &lcovFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                std::__cxx11::string::operator=
                          ((string *)this_00,(string *)(daGlob.field_2._M_local_buf + 8));
                std::__cxx11::string::~string((string *)(daGlob.field_2._M_local_buf + 8));
                std::__cxx11::string::string((string *)local_1e40);
                std::__cxx11::string::operator=((string *)local_1e40,(string *)this_00);
                std::__cxx11::string::operator+=((string *)local_1e40,"/*.LCOV");
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1fb8);
                poVar6 = std::operator<<((ostream *)local_1fb8,"   looking for LCOV files in: ");
                poVar6 = std::operator<<(poVar6,(string *)local_1e40);
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,5,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x5b6,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                std::__cxx11::string::~string((string *)&__range3);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1fb8);
                cmsys::Glob::FindFiles
                          ((Glob *)((long)&dir.field_2 + 8),(string *)local_1e40,(GlobMessages *)0x0
                          );
                r = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&dir.field_2 + 8));
                cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1e00,r);
                __end3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_1e00);
                file = (string *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1e00);
                while (bVar3 = __gnu_cxx::operator!=
                                         (&__end3,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&file), bVar3) {
                  pbVar7 = __gnu_cxx::
                           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&__end3);
                  std::__cxx11::string::operator=((string *)&gl.ListDirs,(string *)pbVar7);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  std::ifstream::ifstream(&local_2200,pcVar5,_S_in);
                  bVar4 = std::ios::operator!((ios *)((long)&local_2200 +
                                                     *(long *)(local_2200 + -0x18)));
                  if ((bVar4 & 1) != 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2378);
                    poVar6 = std::operator<<((ostream *)local_2378,"Cannot open file: ");
                    poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::ostringstream::str();
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    cmCTest::Log(pcVar1,7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5c0,pcVar5,false);
                    std::__cxx11::string::~string((string *)(srcname.field_2._M_local_buf + 8));
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2378);
                  }
                  std::__cxx11::string::string((string *)local_23b8);
                  bVar3 = cmsys::SystemTools::GetLineFromStream
                                    ((istream *)&local_2200,(string *)local_23b8,(bool *)0x0,-1);
                  if (bVar3) {
                    std::__cxx11::string::substr((ulong)&__range4,(ulong)local_23b8);
                    std::__cxx11::string::operator=((string *)local_23b8,(string *)&__range4);
                    std::__cxx11::string::~string((string *)&__range4);
                    std::__cxx11::string::operator=
                              ((string *)(lcovFile.field_2._M_local_buf + 8),(string *)local_23b8);
                    std::__cxx11::string::operator=((string *)local_a40,(string *)local_23b8);
                    __end4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_1e00);
                    t = (string *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1e00);
                    while (bVar3 = __gnu_cxx::operator!=
                                             (&__end4,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&t), bVar3) {
                      pbVar7 = __gnu_cxx::
                               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*(&__end4);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2710);
                      poVar6 = std::operator<<((ostream *)local_2710,"Found LCOV File: ");
                      poVar6 = std::operator<<(poVar6,(string *)pbVar7);
                      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::ostringstream::str();
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      cmCTest::Log(pcVar1,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5d5,pcVar5,
                                   (bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                      std::__cxx11::string::~string(local_2730);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2710);
                      __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&__end4);
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_28a8);
                    poVar6 = std::operator<<((ostream *)local_28a8,"SourceFile: ");
                    poVar6 = std::operator<<(poVar6,(string *)(lcovFile.field_2._M_local_buf + 8));
                    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::ostringstream::str();
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    cmCTest::Log(pcVar1,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5d9,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1)
                                );
                    std::__cxx11::string::~string(local_28c8);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_28a8);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a40);
                    poVar6 = std::operator<<((ostream *)local_2a40,"lCovFile: ");
                    poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::ostringstream::str();
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    cmCTest::Log(pcVar1,5,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5db,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1)
                                );
                    std::__cxx11::string::~string((string *)&vec);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a40);
                    uVar9 = std::__cxx11::string::empty();
                    if (((uVar9 & 1) == 0) &&
                       (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
                      this_01 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)(lcovCommand.field_2._8_8_ + 0x48),
                                             (key_type *)local_a40);
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2be0);
                      poVar6 = std::operator<<((ostream *)local_2be0,"   in lcovFile: ");
                      poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                      std::__cxx11::ostringstream::str();
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      cmCTest::Log(pcVar1,5,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                   ,0x5e4,pcVar5,
                                   (bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                      std::__cxx11::string::~string(local_2c00);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2be0);
                      pcVar5 = (char *)std::__cxx11::string::c_str();
                      std::ifstream::ifstream(&local_2e08,pcVar5,_S_in);
                      bVar4 = std::ios::operator!((ios *)((long)&local_2e08 +
                                                         *(long *)(local_2e08 + -0x18)));
                      if ((bVar4 & 1) == 0) {
                        nl.field_2._8_8_ = 0xffffffffffffffff;
                        std::__cxx11::string::string((string *)local_2fc8);
                        cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&local_2e08,(string *)local_2fc8,(bool *)0x0,-1);
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3140);
                        poVar6 = std::operator<<((ostream *)local_3140,
                                                 "File is ready, start reading.");
                        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::ostringstream::str();
                        pcVar5 = (char *)std::__cxx11::string::c_str();
                        cmCTest::Log(pcVar1,5,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5f2,pcVar5,
                                     (bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                        std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3140);
                        while (bVar3 = cmsys::SystemTools::GetLineFromStream
                                                 ((istream *)&local_2e08,(string *)local_2fc8,
                                                  (bool *)0x0,-1), bVar3) {
                          nl.field_2._8_8_ = nl.field_2._8_8_ + 1;
                          uVar9 = std::__cxx11::string::empty();
                          if (((uVar9 & 1) == 0) &&
                             (uVar9 = std::__cxx11::string::size(), 0xb < uVar9)) {
                            std::__cxx11::string::substr((ulong)local_3180,(ulong)local_2fc8);
                            pcVar5 = (char *)std::__cxx11::string::c_str();
                            lineNumber.field_2._12_4_ = atoi(pcVar5);
                            std::__cxx11::string::substr((ulong)local_31a8,(ulong)local_2fc8);
                            pcVar5 = (char *)std::__cxx11::string::c_str();
                            local_31ac = atoi(pcVar5);
                            local_31ac = local_31ac + -1;
                            if (-1 < local_31ac) {
                              while (sVar12 = std::vector<int,_std::allocator<int>_>::size(this_01),
                                    sVar12 <= (ulong)(long)local_31ac) {
                                local_31b0 = -1;
                                std::vector<int,_std::allocator<int>_>::push_back
                                          (this_01,&local_31b0);
                              }
                              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  (this_01,(long)local_31ac);
                              if ((*pvVar10 < 0) &&
                                 ((0 < (int)lineNumber.field_2._12_4_ ||
                                  (lVar11 = std::__cxx11::string::find((char)local_3180,0x23),
                                  lVar11 != -1)))) {
                                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                                    (this_01,(long)local_31ac);
                                *pvVar10 = 0;
                              }
                              uVar2 = lineNumber.field_2._12_4_;
                              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                                  (this_01,(long)local_31ac);
                              *pvVar10 = uVar2 + *pvVar10;
                            }
                            std::__cxx11::string::~string(local_31a8);
                            std::__cxx11::string::~string(local_3180);
                          }
                        }
                        std::__cxx11::string::~string((string *)local_2fc8);
                      }
                      else {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f80);
                        poVar6 = std::operator<<((ostream *)local_2f80,"Cannot open file: ");
                        poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                        std::__cxx11::ostringstream::str();
                        pcVar5 = (char *)std::__cxx11::string::c_str();
                        cmCTest::Log(pcVar1,7,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                     ,0x5e9,pcVar5,false);
                        std::__cxx11::string::~string((string *)&cnt);
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f80);
                      }
                      std::__cxx11::string::clear();
                      std::ifstream::~ifstream(&local_2e08);
                    }
                    st2lcovOutputRex3.field_2._12_4_ = 0;
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2538);
                    poVar6 = std::operator<<((ostream *)local_2538,
                                             "Error while parsing lcov file \'");
                    poVar6 = std::operator<<(poVar6,(string *)&gl.ListDirs);
                    poVar6 = std::operator<<(poVar6,"\':");
                    poVar6 = std::operator<<(poVar6," No source file name found!");
                    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::ostringstream::str();
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    cmCTest::Log(pcVar1,7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x5c9,pcVar5,false);
                    std::__cxx11::string::~string(local_2558);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2538);
                    this_local._4_4_ = 0;
                    st2lcovOutputRex3.field_2._12_4_ = 1;
                  }
                  std::__cxx11::string::~string((string *)local_23b8);
                  std::ifstream::~ifstream(&local_2200);
                  if (st2lcovOutputRex3.field_2._12_4_ != 0) goto LAB_0019b299;
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&__end3);
                }
                st2lcovOutputRex3.field_2._12_4_ = 0;
LAB_0019b299:
                std::__cxx11::string::~string((string *)local_1e40);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1e00);
                std::__cxx11::string::~string
                          ((string *)
                           &lcovFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                cmsys::Glob::~Glob((Glob *)((long)&dir.field_2 + 8));
                std::__cxx11::string::~string((string *)&gl.ListDirs);
                std::__cxx11::string::~string((string *)(lcovFile.field_2._M_local_buf + 8));
                if (st2lcovOutputRex3.field_2._12_4_ != 0) goto LAB_0019b5ad;
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end2);
              }
              locale_C.lc_all.field_2._12_4_ = locale_C.lc_all.field_2._12_4_ + 1;
              if ((int)locale_C.lc_all.field_2._12_4_ % 0x32 == 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3328);
                poVar6 = std::operator<<((ostream *)local_3328," processed: ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,locale_C.lc_all.field_2._12_4_);
                poVar6 = std::operator<<(poVar6," out of ");
                sVar12 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_6a0);
                pvVar8 = (void *)std::ostream::operator<<(poVar6,sVar12);
                std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x627,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                std::__cxx11::string::~string(local_3348);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3328);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_34c0);
                std::operator<<((ostream *)local_34c0,"    ");
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::ostringstream::str();
                pcVar5 = (char *)std::__cxx11::string::c_str();
                cmCTest::Log(pcVar1,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                             ,0x628,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
                std::__cxx11::string::~string(local_34e0);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_34c0);
              }
              st2lcovOutputRex3.field_2._12_4_ = 0;
LAB_0019b5ad:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range2);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1678);
              poVar6 = std::operator<<((ostream *)local_1678,"Problem running coverage on file: ");
              poVar6 = std::operator<<(poVar6,(string *)pbVar7);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x588,pcVar5,false);
              std::__cxx11::string::~string(local_1698);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1678);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1810);
              poVar6 = std::operator<<((ostream *)local_1810,"Command produced error: ");
              poVar6 = std::operator<<(poVar6,(string *)&res);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar5 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x58a,pcVar5,false);
              std::__cxx11::string::~string(local_1830);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1810);
              *(int *)lcovCommand.field_2._8_8_ = *(int *)lcovCommand.field_2._8_8_ + 1;
              st2lcovOutputRex3.field_2._12_4_ = 0x11;
            }
            std::__cxx11::string::~string((string *)&res);
            std::__cxx11::string::~string((string *)(errors.field_2._M_local_buf + 8));
          }
          cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_fe8);
          std::__cxx11::string::~string((string *)&workdir.ResultCode);
          if ((st2lcovOutputRex3.field_2._12_4_ != 0) && (st2lcovOutputRex3.field_2._12_4_ != 0x11))
          goto LAB_0019b66c;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end1);
        }
        this_local._4_4_ = locale_C.lc_all.field_2._12_4_;
        st2lcovOutputRex3.field_2._12_4_ = 1;
LAB_0019b66c:
        std::__cxx11::string::~string((string *)&__range1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_db0);
        cmCTestCoverageHandlerLocale::~cmCTestCoverageHandlerLocale
                  ((cmCTestCoverageHandlerLocale *)
                   &covargs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)local_a40);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&actualSourceFile.field_2 + 8));
        std::__cxx11::string::~string
                  ((string *)&missingFiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_818);
      std::operator<<((ostream *)local_818,"Error while finding LCov files.\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x545,pcVar5,false);
      std::__cxx11::string::~string(local_838);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_818);
      this_local._4_4_ = 0;
      st2lcovOutputRex3.field_2._12_4_ = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6a0);
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_358);
    std::__cxx11::string::~string(local_280);
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::HandleLCovCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string lcovCommand =
    this->CTest->GetCTestConfiguration("CoverageCommand");
  std::string lcovExtraFlags =
    this->CTest->GetCTestConfiguration("CoverageExtraFlags");
  if (lcovCommand != "codecov") {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Not a valid Intel Coverage command." << std::endl,
                       this->Quiet);
    return 0;
  }
  // There is only percentage completed output from LCOV
  std::string st2lcovOutputRex3 = "[0-9]+%";
  cmsys::RegularExpression st2re3(st2lcovOutputRex3.c_str());

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " This is coverage command: " << lcovCommand << std::endl,
                     this->Quiet);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     " These are coverage command flags: " << lcovExtraFlags
                                                           << std::endl,
                     this->Quiet);

  std::vector<std::string> files;
  if (!this->FindLCovFiles(files)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding LCov files.\n");
    return 0;
  }

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any LCov coverage files." << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }
  std::string testingDir = this->CTest->GetBinaryDir();

  std::set<std::string> missingFiles;

  std::string actualSourceFile;
  cmCTestOptionalLog(
    this->CTest, HANDLER_OUTPUT,
    "   Processing coverage (each . represents one file):" << std::endl,
    this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
  int file_count = 0;

  // make sure output from lcov is in English!
  cmCTestCoverageHandlerLocale locale_C;
  static_cast<void>(locale_C);

  std::vector<std::string> covargs =
    cmSystemTools::ParseArguments(lcovExtraFlags);
  covargs.insert(covargs.begin(), lcovCommand);
  const std::string command = joinCommandLine(covargs);

  // In intel compiler we have to call codecov only once in each executable
  // directory. It collects all *.dyn files to generate .dpi file.
  for (std::string const& f : files) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "." << std::flush,
                       this->Quiet);
    std::string fileDir = cmSystemTools::GetFilenamePath(f);
    cmWorkingDirectory workdir(fileDir);
    if (workdir.Failed()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to change working directory to "
                   << fileDir << " : "
                   << std::strerror(workdir.GetLastResult()) << std::endl);
      cont->Error++;
      continue;
    }

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Current coverage dir: " << fileDir << std::endl,
                       this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       command << std::endl, this->Quiet);

    std::string output;
    std::string errors;
    int retVal = 0;
    *cont->OFS << "* Run coverage for: " << fileDir << std::endl;
    *cont->OFS << "  Command: " << command << std::endl;
    int res = this->CTest->RunCommand(covargs, &output, &errors, &retVal,
                                      fileDir.c_str(),
                                      cmDuration::zero() /*this->TimeOut*/);

    *cont->OFS << "  Output: " << output << std::endl;
    *cont->OFS << "  Errors: " << errors << std::endl;
    if (!res) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem running coverage on file: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << errors << std::endl);
      cont->Error++;
      continue;
    }
    if (retVal != 0) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Coverage command returned: "
                   << retVal << " while processing: " << f << std::endl);
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Command produced error: " << cont->Error << std::endl);
    }
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "--------------------------------------------------------------"
        << std::endl
        << output << std::endl
        << "--------------------------------------------------------------"
        << std::endl,
      this->Quiet);

    std::vector<std::string> lines;
    cmsys::SystemTools::Split(output, lines);

    for (std::string const& line : lines) {
      std::string sourceFile;
      std::string lcovFile;

      if (line.empty()) {
        // Ignore empty line
      }
      // Look for LCOV files in binary directory
      // Intel Compiler creates a CodeCoverage dir for each subfolder and
      // each subfolder has LCOV files
      cmsys::Glob gl;
      gl.RecurseOn();
      gl.RecurseThroughSymlinksOff();
      std::string dir;
      std::vector<std::string> lcovFiles;
      dir = this->CTest->GetBinaryDir();
      std::string daGlob;
      daGlob = dir;
      daGlob += "/*.LCOV";
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "   looking for LCOV files in: " << daGlob << std::endl, this->Quiet);
      gl.FindFiles(daGlob);
      // Keep a list of all LCOV files
      cmAppend(lcovFiles, gl.GetFiles());

      for (std::string const& file : lcovFiles) {
        lcovFile = file;
        cmsys::ifstream srcead(lcovFile.c_str());
        if (!srcead) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot open file: " << lcovFile << std::endl);
        }
        std::string srcname;

        int success = cmSystemTools::GetLineFromStream(srcead, srcname);
        if (!success) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Error while parsing lcov file '"
                       << lcovFile << "':"
                       << " No source file name found!" << std::endl);
          return 0;
        }
        srcname = srcname.substr(18);
        // We can directly read found LCOV files to determine the source
        // files
        sourceFile = srcname;
        actualSourceFile = srcname;

        for (std::string const& t : lcovFiles) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Found LCOV File: " << t << std::endl,
                             this->Quiet);
        }
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "SourceFile: " << sourceFile << std::endl,
                           this->Quiet);
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "lCovFile: " << lcovFile << std::endl, this->Quiet);

        // If we have some LCOV files to process
        if (!lcovFile.empty() && !actualSourceFile.empty()) {
          cmCTestCoverageHandlerContainer::SingleFileCoverageVector& vec =
            cont->TotalCoverage[actualSourceFile];

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "   in lcovFile: " << lcovFile << std::endl,
                             this->Quiet);

          cmsys::ifstream ifile(lcovFile.c_str());
          if (!ifile) {
            cmCTestLog(this->CTest, ERROR_MESSAGE,
                       "Cannot open file: " << lcovFile << std::endl);
          } else {
            long cnt = -1;
            std::string nl;

            // Skip the first line
            cmSystemTools::GetLineFromStream(ifile, nl);
            cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                               "File is ready, start reading." << std::endl,
                               this->Quiet);
            while (cmSystemTools::GetLineFromStream(ifile, nl)) {
              cnt++;

              // Skip empty lines
              if (nl.empty()) {
                continue;
              }

              // Skip unused lines
              if (nl.size() < 12) {
                continue;
              }

              // Read the coverage count from the beginning of the lcov
              // output line
              std::string prefix = nl.substr(0, 17);
              int cov = atoi(prefix.c_str());

              // Read the line number starting at the 17th character of the
              // lcov output line
              std::string lineNumber = nl.substr(17, 7);

              int lineIdx = atoi(lineNumber.c_str()) - 1;
              if (lineIdx >= 0) {
                while (vec.size() <= static_cast<size_t>(lineIdx)) {
                  vec.push_back(-1);
                }

                // Initially all entries are -1 (not used). If we get coverage
                // information, increment it to 0 first.
                if (vec[lineIdx] < 0) {
                  if (cov > 0 || prefix.find('#') != std::string::npos) {
                    vec[lineIdx] = 0;
                  }
                }

                vec[lineIdx] += cov;
              }
            }
          }

          actualSourceFile.clear();
        }
      }
    }

    file_count++;

    if (file_count % 50 == 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         " processed: " << file_count << " out of "
                                        << files.size() << std::endl,
                         this->Quiet);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "    ", this->Quiet);
    }
  }

  return file_count;
}